

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuSloppyState::enter(QMenuSloppyState *this)

{
  bool bVar1;
  QMenuPrivate *pQVar2;
  long in_RDI;
  QMenuPrivate *in_stack_00000010;
  QMenuPrivate *menuPriv;
  QMenu *in_stack_00000058;
  QMenuSloppyState *in_stack_ffffffffffffffd8;
  QMenuPrivate *in_stack_ffffffffffffffe0;
  
  pQVar2 = QMenuPrivate::get((QMenu *)0x6426df);
  if (((*(byte *)(in_RDI + 0x6c) >> 3 & 1) != 0) &&
     (bVar1 = ::operator==((QPointer<QMenu> *)in_stack_ffffffffffffffe0,
                           (QPointer<QMenu> *)in_stack_ffffffffffffffd8), bVar1)) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x642730);
    QMenuPrivate::hideMenu(in_stack_00000010,in_stack_00000058);
    reset(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = pQVar2;
  }
  if (*(long *)(in_RDI + 0x58) != 0) {
    childEnter((QMenuSloppyState *)in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void QMenuSloppyState::enter()
{
    QMenuPrivate *menuPriv = QMenuPrivate::get(m_menu);

    if (m_discard_state_when_entering_parent && m_sub_menu == menuPriv->activeMenu) {
        menuPriv->hideMenu(m_sub_menu);
        reset();
    }
    if (m_parent)
        m_parent->childEnter();
}